

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::GlyphRangesBuilder::AddRanges(GlyphRangesBuilder *this,ImWchar *ranges)

{
  ImWchar *pIVar1;
  ImWchar c;
  ImWchar IVar2;
  
  IVar2 = *ranges;
  while (IVar2 != 0) {
    for (; IVar2 <= ranges[1]; IVar2 = IVar2 + 1) {
      SetBit(this,(uint)IVar2);
    }
    pIVar1 = ranges + 2;
    ranges = ranges + 2;
    IVar2 = *pIVar1;
  }
  return;
}

Assistant:

void ImFontAtlas::GlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}